

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O3

void __thiscall mwheel::implementation::PluginUnloader::~PluginUnloader(PluginUnloader *this)

{
  _Any_data *p_Var1;
  undefined8 uVar2;
  _Any_data *p_Var3;
  
  p_Var3 = (_Any_data *)
           (this->m_callback).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (_Any_data *)
           (this->m_callback).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (p_Var3 == p_Var1) {
      std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                (&this->m_callback);
      return;
    }
    if (*(long *)(p_Var3 + 1) == 0) break;
    (**(code **)(p_Var3->_M_pod_data + 0x18))(p_Var3);
    p_Var3 = p_Var3 + 2;
  }
  uVar2 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar2);
}

Assistant:

~PluginUnloader() {
    for (const auto &x : m_callback) {
      x();
    }
  }